

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O1

int av1_cost_coeffs_txb(MACROBLOCK *x,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type,
                       TXB_CTX *txb_ctx,int reduced_tx_set_used)

{
  TX_CLASS tx_class;
  char cVar1;
  ushort eob;
  short sVar2;
  int16_t *scan;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined7 in_register_00000009;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  LV_MAP_COEFF_COST *txb_costs;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  tran_low_t *ptVar24;
  uint uVar25;
  bool bVar26;
  uint8_t levels_buf [1312];
  byte local_1558 [1312];
  int8_t local_1038 [4104];
  
  eob = x->plane[plane].eobs[block];
  uVar19 = CONCAT71(in_register_00000009,tx_size) & 0xffffffff;
  uVar15 = (uint)""[uVar19] + (uint)""[uVar19] + 1 >> 1 & 0xff;
  bVar26 = plane != 0;
  txb_costs = (x->coeff_costs).coeff_costs[uVar15] + bVar26;
  if (eob == 0) {
    return (x->coeff_costs).coeff_costs[uVar15][bVar26].txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  }
  uVar20 = (ulong)tx_type;
  if (tx_size < 0x11) {
    uVar13 = 3;
    if ((1 < tx_size - 0xb) && (tx_size != '\x04')) {
LAB_00244b1e:
      uVar13 = uVar19;
    }
  }
  else if (tx_size == '\x11') {
    uVar13 = 9;
  }
  else {
    if (tx_size != '\x12') goto LAB_00244b1e;
    uVar13 = 10;
  }
  if (tx_size < 0x11) {
    uVar16 = 3;
    if ((1 < tx_size - 0xb) && (tx_size != '\x04')) {
LAB_00244b68:
      uVar16 = uVar19;
    }
  }
  else if (tx_size == '\x11') {
    uVar16 = 9;
  }
  else {
    if (tx_size != '\x12') goto LAB_00244b68;
    uVar16 = 10;
  }
  tx_class = ""[uVar20];
  ptVar24 = x->plane[plane].qcoeff + (block << 4);
  uVar25 = (uint)tx_size;
  if (uVar25 < 0x11) {
    uVar18 = 3;
    if ((1 < uVar25 - 0xb) && (uVar25 != 4)) {
LAB_00244bf1:
      uVar18 = uVar19;
    }
  }
  else if (uVar25 == 0x11) {
    uVar18 = 9;
  }
  else {
    if (uVar25 != 0x12) goto LAB_00244bf1;
    uVar18 = 10;
  }
  iVar11 = tx_size_high_log2[uVar13];
  scan = *(int16_t **)
          ((long)&av1_scan_orders[0][tx_type].scan +
          (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_size) << 8));
  cVar1 = ""[uVar19];
  iVar12 = txb_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][0];
  (*av1_txb_init_levels)(ptVar24,tx_size_wide[uVar16],tx_size_high[uVar18],local_1558);
  iVar4 = get_tx_type_cost(x,&x->e_mbd,plane,tx_size,tx_type,reduced_tx_set_used);
  iVar5 = get_eob_cost((uint)eob,(x->coeff_costs).eob_costs[cVar1] + bVar26,txb_costs,tx_class);
  av1_get_nz_map_contexts_sse2(local_1558,scan,eob,tx_size,tx_class,local_1038);
  uVar25 = eob - 1;
  sVar2 = scan[uVar25];
  uVar9 = ptVar24[sVar2];
  uVar6 = -uVar9;
  if (0 < (int)uVar9) {
    uVar6 = uVar9;
  }
  uVar10 = 3;
  if ((int)uVar6 < 3) {
    uVar10 = uVar6;
  }
  iVar12 = iVar5 + iVar4 + iVar12 +
           txb_costs->base_eob_cost[(long)local_1038[sVar2] + -1][(long)(int)uVar10 + 2];
  bVar3 = true;
  bVar7 = (byte)iVar11;
  if (uVar9 != 0) {
    if (2 < uVar6) {
      iVar11 = (int)sVar2 >> (bVar7 & 0x1f);
      iVar4 = iVar11 << (bVar7 & 0x1f);
      if (sVar2 == 0) {
        lVar17 = 0;
      }
      else {
        lVar17 = 7;
        if ((((9 < tx_type) || (1 < sVar2 - iVar4)) || (1 < iVar11)) &&
           (((0xa800UL >> (uVar20 & 0x3f) & 1) == 0 || (iVar11 != 0)))) {
          if (sVar2 != iVar4) {
            lVar17 = 0xe;
          }
          if ((0x5400UL >> (uVar20 & 0x3f) & 1) == 0) {
            lVar17 = 0xe;
          }
        }
      }
      uVar10 = 0x1f;
      if (uVar6 - 0xe != 0) {
        for (; uVar6 - 0xe >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar19 = 0xf;
      if ((int)uVar6 < 0xf) {
        uVar19 = (ulong)uVar6;
      }
      uVar8 = 0;
      if (0xe < uVar6) {
        uVar8 = (uVar10 ^ 0x1f) << 10 ^ 0x7e00;
      }
      iVar12 = uVar8 + iVar12 +
               (x->coeff_costs).coeff_costs[uVar15][bVar26].lps_cost[lVar17 + -1][uVar19 + 0x17];
    }
    if (uVar25 == 0) {
      iVar12 = iVar12 + txb_costs->dc_sign_cost[txb_ctx->dc_sign_ctx][uVar9 >> 0x1f];
      bVar3 = false;
    }
    else {
      iVar12 = iVar12 + 0x200;
    }
  }
  if (!bVar3) {
    return iVar12;
  }
  uVar25 = eob - 2;
  if (2 < eob) {
    iVar11 = 1 << (bVar7 & 0x1f);
    iVar4 = iVar11 + 4;
    lVar17 = (ulong)uVar25 + 1;
    do {
      sVar2 = scan[lVar17 + -1];
      uVar9 = ptVar24[sVar2];
      uVar6 = -uVar9;
      if (0 < (int)uVar9) {
        uVar6 = uVar9;
      }
      uVar20 = (ulong)uVar6;
      uVar19 = 3;
      if (uVar6 < 3) {
        uVar19 = (ulong)uVar6;
      }
      iVar12 = iVar12 + (x->coeff_costs).coeff_costs[uVar15][bVar26].base_cost[local_1038[sVar2]]
                        [uVar19];
      if ((uVar9 != 0) && (iVar12 = iVar12 + 0x200, 2 < uVar6)) {
        iVar5 = (int)sVar2 >> (bVar7 & 0x1f);
        iVar23 = iVar5 << (bVar7 & 0x1f);
        iVar22 = sVar2 - iVar23;
        iVar21 = iVar5 * iVar4 + iVar22;
        lVar14 = (long)(iVar4 + iVar21);
        uVar9 = (uint)local_1558[lVar14] + (uint)local_1558[(long)iVar21 + 1];
        if (tx_class == '\x02') {
          uVar9 = uVar9 + local_1558[(long)iVar21 + 2] + 1 >> 1;
          if (5 < uVar9) {
            uVar9 = 6;
          }
          if (sVar2 != 0) {
            if (sVar2 != iVar23) goto LAB_00244f5a;
LAB_00244f8a:
            uVar9 = uVar9 + 7;
          }
        }
        else if (tx_class == '\x01') {
          uVar9 = uVar9 + local_1558[iVar21 + iVar11 * 2 + 8] + 1 >> 1;
          if (5 < uVar9) {
            uVar9 = 6;
          }
          if (sVar2 != 0) {
            if (iVar5 == 0) goto LAB_00244f8a;
            goto LAB_00244f5a;
          }
        }
        else if (tx_class == '\0') {
          uVar9 = uVar9 + local_1558[lVar14 + 1] + 1 >> 1;
          if (5 < uVar9) {
            uVar9 = 6;
          }
          if (sVar2 != 0) {
            if ((1 < iVar5) || (1 < iVar22)) goto LAB_00244f5a;
            uVar9 = uVar9 + 7;
          }
        }
        else {
LAB_00244f5a:
          uVar9 = uVar9 + 0xe;
        }
        uVar10 = 0x1f;
        if (uVar6 - 0xe != 0) {
          for (; uVar6 - 0xe >> uVar10 == 0; uVar10 = uVar10 - 1) {
          }
        }
        uVar10 = (uVar10 ^ 0x1f) << 10 ^ 0x7e00;
        if (0xe < (int)uVar6) {
          uVar20 = 0xf;
        }
        if (uVar6 < 0xf) {
          uVar10 = 0;
        }
        iVar12 = uVar10 + iVar12 +
                 (x->coeff_costs).coeff_costs[uVar15][bVar26].lps_cost[(ulong)uVar9 - 1]
                 [uVar20 + 0x17];
      }
      lVar17 = lVar17 + -1;
      uVar25 = uVar25 - 1;
    } while (1 < lVar17);
  }
  sVar2 = scan[(int)uVar25];
  uVar25 = ptVar24[sVar2];
  uVar9 = -uVar25;
  if (0 < (int)uVar25) {
    uVar9 = uVar25;
  }
  uVar19 = 3;
  if ((int)uVar9 < 3) {
    uVar19 = (ulong)uVar9;
  }
  iVar12 = iVar12 + (x->coeff_costs).coeff_costs[uVar15][bVar26].base_cost[local_1038[sVar2]]
                    [uVar19];
  if (uVar25 == 0) {
    return iVar12;
  }
  iVar12 = iVar12 + txb_costs->dc_sign_cost[txb_ctx->dc_sign_ctx][uVar25 >> 0x1f];
  if (uVar9 < 3) {
    return iVar12;
  }
  iVar5 = (int)sVar2 >> (bVar7 & 0x1f);
  iVar22 = iVar5 << (bVar7 & 0x1f);
  iVar4 = 1 << (bVar7 & 0x1f);
  iVar21 = sVar2 - iVar22;
  iVar11 = iVar4 + 4;
  iVar23 = iVar5 * iVar11 + iVar21;
  lVar17 = (long)(iVar4 + iVar23 + 4);
  uVar25 = (uint)local_1558[lVar17] + (uint)local_1558[(long)iVar23 + 1];
  if (tx_class == '\x02') {
    uVar6 = local_1558[(long)iVar23 + 2] + uVar25 + 1 >> 1;
    uVar25 = 6;
    if (uVar6 < 6) {
      uVar25 = uVar6;
    }
    if (sVar2 == 0) goto LAB_0024510c;
    if (sVar2 == iVar22) {
LAB_00245109:
      uVar25 = uVar25 + 7;
      goto LAB_0024510c;
    }
  }
  else if (tx_class == '\x01') {
    uVar6 = local_1558[iVar23 + iVar11 * 2] + uVar25 + 1 >> 1;
    uVar25 = 6;
    if (uVar6 < 6) {
      uVar25 = uVar6;
    }
    if (sVar2 == 0) goto LAB_0024510c;
    if (iVar5 == 0) goto LAB_00245109;
  }
  else if (tx_class == '\0') {
    uVar6 = local_1558[lVar17 + 1] + uVar25 + 1 >> 1;
    uVar25 = 6;
    if (uVar6 < 6) {
      uVar25 = uVar6;
    }
    if (sVar2 == 0) goto LAB_0024510c;
    if ((iVar5 < 2) && (iVar21 < 2)) goto LAB_00245109;
  }
  uVar25 = uVar25 + 0xe;
LAB_0024510c:
  uVar6 = 0x1f;
  if (uVar9 - 0xe != 0) {
    for (; uVar9 - 0xe >> uVar6 == 0; uVar6 = uVar6 - 1) {
    }
  }
  uVar19 = 0xf;
  if ((int)uVar9 < 0xf) {
    uVar19 = (ulong)uVar9;
  }
  uVar10 = 0;
  if (0xe < uVar9) {
    uVar10 = (uVar6 ^ 0x1f) << 10 ^ 0x7e00;
  }
  return iVar12 + uVar10 +
         (x->coeff_costs).coeff_costs[uVar15][bVar26].lps_cost[(ulong)uVar25 - 1][uVar19 + 0x17];
}

Assistant:

int av1_cost_coeffs_txb(const MACROBLOCK *x, const int plane, const int block,
                        const TX_SIZE tx_size, const TX_TYPE tx_type,
                        const TXB_CTX *const txb_ctx, int reduced_tx_set_used) {
  const struct macroblock_plane *p = &x->plane[plane];
  const int eob = p->eobs[block];
  const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
  const PLANE_TYPE plane_type = get_plane_type(plane);
  const LV_MAP_COEFF_COST *const coeff_costs =
      &x->coeff_costs.coeff_costs[txs_ctx][plane_type];
  if (eob == 0) {
    return coeff_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  }

  const MACROBLOCKD *const xd = &x->e_mbd;
  const TX_CLASS tx_class = tx_type_to_class[tx_type];

  return warehouse_efficients_txb(x, plane, block, tx_size, txb_ctx, p, eob,
                                  plane_type, coeff_costs, xd, tx_type,
                                  tx_class, reduced_tx_set_used);
}